

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strassen-lace.c
# Opt level: O2

void matrixmul(int n,REAL *A,int an,REAL *B,int bn,REAL *C,int cn)

{
  ulong uVar1;
  ulong uVar2;
  double *pdVar3;
  ulong uVar4;
  REAL *pRVar5;
  ulong uVar6;
  double dVar7;
  
  uVar1 = 0;
  uVar2 = 0;
  if (0 < n) {
    uVar2 = (ulong)(uint)n;
  }
  for (; uVar1 != uVar2; uVar1 = uVar1 + 1) {
    pRVar5 = B;
    for (uVar6 = 0; uVar6 != (uint)n; uVar6 = uVar6 + 1) {
      dVar7 = 0.0;
      pdVar3 = pRVar5;
      for (uVar4 = 0; (uint)n != uVar4; uVar4 = uVar4 + 1) {
        dVar7 = dVar7 + A[uVar4] * *pdVar3;
        pdVar3 = pdVar3 + bn;
      }
      C[uVar1 * (long)cn + uVar6] = dVar7;
      pRVar5 = pRVar5 + 1;
    }
    A = A + an;
  }
  return;
}

Assistant:

void matrixmul(int n, REAL *A, int an, REAL *B, int bn, REAL *C, int cn)
{
    int i, j, k;
    REAL s;

    for (i = 0; i < n; ++i)
        for (j = 0; j < n; ++j) {
            s = 0.0;
            for (k = 0; k < n; ++k)
                s += ELEM(A, an, i, k) * ELEM(B, bn, k, j);

            ELEM(C, cn, i, j) = s;
        }
}